

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O3

void appendVecToMasterVecInt(Vec_Ptr_t *masterVec,Vec_Ptr_t *candVec)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  int *piVar4;
  void *__dest;
  void **ppvVar5;
  size_t __size;
  long lVar6;
  
  if (masterVec == (Vec_Ptr_t *)0x0) {
    __assert_fail("masterVec != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/disjunctiveMonotone.c"
                  ,0x23c,"void appendVecToMasterVecInt(Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (candVec != (Vec_Ptr_t *)0x0) {
    if (0 < candVec->nSize) {
      lVar6 = 0;
      do {
        pvVar3 = candVec->pArray[lVar6];
        piVar4 = (int *)malloc(0x10);
        iVar1 = *(int *)((long)pvVar3 + 4);
        piVar4[1] = iVar1;
        *piVar4 = iVar1;
        if ((long)iVar1 == 0) {
          __size = 0;
          __dest = (void *)0x0;
        }
        else {
          __size = (long)iVar1 << 2;
          __dest = malloc(__size);
        }
        *(void **)(piVar4 + 2) = __dest;
        memcpy(__dest,*(void **)((long)pvVar3 + 8),__size);
        uVar2 = masterVec->nSize;
        if (uVar2 == masterVec->nCap) {
          if ((int)uVar2 < 0x10) {
            if (masterVec->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(masterVec->pArray,0x80);
            }
            masterVec->pArray = ppvVar5;
            masterVec->nCap = 0x10;
          }
          else {
            if (masterVec->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(masterVec->pArray,(ulong)uVar2 << 4);
            }
            masterVec->pArray = ppvVar5;
            masterVec->nCap = uVar2 * 2;
          }
        }
        else {
          ppvVar5 = masterVec->pArray;
        }
        iVar1 = masterVec->nSize;
        masterVec->nSize = iVar1 + 1;
        ppvVar5[iVar1] = piVar4;
        lVar6 = lVar6 + 1;
      } while (lVar6 < candVec->nSize);
    }
    return;
  }
  __assert_fail("candVec != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/disjunctiveMonotone.c"
                ,0x23d,"void appendVecToMasterVecInt(Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

void appendVecToMasterVecInt(Vec_Ptr_t *masterVec, Vec_Ptr_t *candVec )
{
	int i;
	Vec_Int_t *vCand;
	Vec_Int_t *vNewIntVec;

	assert(masterVec != NULL);
	assert(candVec != NULL);
	Vec_PtrForEachEntry( Vec_Int_t *, candVec, vCand, i )
	{
		vNewIntVec = Vec_IntDup(vCand);	
		Vec_PtrPush(masterVec, vNewIntVec);
	}
}